

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_TestTargetLevelRecode_Test::
~LevelTest_TestTargetLevelRecode_Test(LevelTest_TestTargetLevelRecode_Test *this)

{
  void *in_RDI;
  
  ~LevelTest_TestTargetLevelRecode_Test((LevelTest_TestTargetLevelRecode_Test *)0x8b1f58);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevelRecode) {
  if (cpu_used_ == 4 && encoding_mode_ == ::libaom_test::kTwoPassGood) {
    libaom_test::I420VideoSource video("rand_noise_w1280h720.yuv", 1280, 720,
                                       25, 1, 0, 10);
    const int target_level = 0005;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 5000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }
}